

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFATokenizer.h
# Opt level: O0

StdGrammarToken * __thiscall
SGParser::DFATokenizer<SGParser::Generator::StdGrammarToken>::GetNextToken
          (DFATokenizer<SGParser::Generator::StdGrammarToken> *this,StdGrammarToken *token)

{
  DFA *this_00;
  bool bVar1;
  uint uVar2;
  LexemeInfo *pLVar3;
  reference pvVar4;
  bool local_c9;
  LexemeInfo *lexinfo;
  BufferPos local_98;
  uint local_84;
  size_t sStack_80;
  uint accept;
  PosTracker lastTailPos;
  BufferPos startHead;
  BufferPos lastTail;
  uint lastLexemeID;
  uint state;
  undefined1 local_40 [8];
  InputCharReader charReader;
  CodeType code;
  StdGrammarToken *token_local;
  DFATokenizer<SGParser::Generator::StdGrammarToken> *this_local;
  
  TokenizerBase::ByteReader::ByteReader
            ((ByteReader *)&lastLexemeID,
             &(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).super_TokenizerBase)
  ;
  TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>::
  TokenCharReaderBase((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                       *)local_40,(ByteReader *)&lastLexemeID,
                      &(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos);
  do {
    (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).HeadPos.Line =
         (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Line;
    (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).HeadPos.Offset =
         (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset;
    TokenizerBase::AdjustHead
              (&(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                super_TokenizerBase);
    bVar1 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
            ::IsEOF((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                     *)local_40);
    if (bVar1) {
      Generator::StdGrammarToken::CopyFromTokenizer(token,1,this);
      return token;
    }
    lastTail.pBuffer._4_4_ = DFA::GetExpressionStartState(this->pDFA,this->ExpressionStackTop);
    lastTail.pBuffer._0_4_ = 0xffff;
    TokenizerBase::BufferPos::BufferPos((BufferPos *)&startHead.pBuffer);
    join_0x00000010_0x00000000_ =
         TokenizerBase::GetHeadPos
                   (&(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                     super_TokenizerBase);
    sStack_80 = (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Line;
    lastTailPos.Line =
         (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset;
    do {
      this_00 = this->pDFA;
      uVar2 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
              ::GetChar((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                         *)local_40);
      lastTail.pBuffer._4_4_ = DFA::GetTransitionState(this_00,lastTail.pBuffer._4_4_,uVar2);
      if (lastTail.pBuffer._4_4_ == 0xffff) break;
      uVar2 = DFA::GetAcceptState(this->pDFA,lastTail.pBuffer._4_4_);
      local_84 = uVar2;
      if (uVar2 == 0) {
        bVar1 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                ::Advance((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                           *)local_40);
        local_84 = (uint)bVar1;
      }
      else {
        bVar1 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                ::Advance((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                           *)local_40);
        local_84 = (uint)bVar1;
        sStack_80 = (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Line;
        lastTailPos.Line =
             (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset;
        local_98 = TokenizerBase::GetTailPos
                             (&(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                               super_TokenizerBase);
        startHead.pBuffer = (TokenizerBuffer *)local_98.pChar;
        lastTail.pBuffer._0_4_ = uVar2;
      }
    } while (local_84 != 0);
    if ((uint)lastTail.pBuffer == 0xffff) {
      bVar1 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
              ::IsEOF((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                       *)local_40);
      local_c9 = false;
      if (bVar1) {
        _lexinfo = TokenizerBase::GetTailPos
                             (&(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                               super_TokenizerBase);
        local_c9 = TokenizerBase::BufferPos::operator==
                             ((BufferPos *)&lastTailPos.Offset,(BufferPos *)&lexinfo);
      }
      if (local_c9 == false) {
        TokenizerBase::SetTailPos
                  (&(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                    super_TokenizerBase,(BufferPos *)&lastTailPos.Offset);
        (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Line =
             (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).HeadPos.Line;
        (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset =
             (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).HeadPos.Offset;
        charReader._20_4_ = 0;
        bVar1 = TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                ::IsEOF((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                         *)local_40);
        if (!bVar1) {
          TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>::
          Advance((TokenCharReaderBase<SGParser::TokenizerBase::ByteReader,_SGParser::LineOffsetPosTracker>
                   *)local_40);
        }
      }
      else {
        charReader._20_4_ = 1;
      }
      Generator::StdGrammarToken::CopyFromTokenizer(token,charReader._20_4_,this);
      return token;
    }
    TokenizerBase::SetTailPos
              (&(this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).
                super_TokenizerBase,(BufferPos *)&startHead.pBuffer);
    (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Line = sStack_80;
    (this->super_TokenizerImpl<SGParser::Generator::StdGrammarToken>).TailPos.Offset =
         lastTailPos.Line;
    pLVar3 = DFA::GetLexemeInfo(this->pDFA,(uint)lastTail.pBuffer);
    charReader._20_4_ = pLVar3->TokenCode;
    uVar2 = pLVar3->Action & 0xf0000000;
    if (uVar2 == 0x10000000) {
LAB_001772b1:
      this->ExpressionStackTop = pLVar3->Action & 0xfffffff;
    }
    else {
      if (uVar2 == 0x20000000) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&this->ExpressionStack,&this->ExpressionStackTop);
        goto LAB_001772b1;
      }
      if (uVar2 == 0x30000000) {
        bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                          (&this->ExpressionStack);
        if (bVar1) {
          this->ExpressionStackTop = 0;
          Generator::StdGrammarToken::CopyFromTokenizer(token,0,this);
          return token;
        }
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                           (&this->ExpressionStack);
        this->ExpressionStackTop = *pvVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&this->ExpressionStack);
      }
    }
    if (charReader._20_4_ != 0) {
      Generator::StdGrammarToken::CopyFromTokenizer(token,charReader._20_4_,this);
      return token;
    }
  } while( true );
}

Assistant:

Token& DFATokenizer<Token>::GetNextToken(Token& token) {
    CodeType        code;
    InputCharReader charReader{ByteReader{*this}, TailPos};

    do {
        // If we are tracking the position
        // than adjust the head values
        HeadPos = TailPos;

        // Move the head to tail
        AdjustHead();

        // If tail's passed the end, EOF
        if (charReader.IsEOF()) {
            token.CopyFromTokenizer(TokenCode::TokenEOF, *this);
            return token;
        }

        // Try to find the longest matching lexeme
        // Keep going through the DFA until we hit an error condition,
        // that is, we get stuck and have nowhere to go

        // The initial state of a DFA is always the zeroth state
        unsigned state        = pDFA->GetExpressionStartState(ExpressionStackTop);
        unsigned lastLexemeID = DFA::EmptyTransition;
        // Last recognized Tail
        BufferPos lastTail;
        // Save start head, so that we can see if we moved at all
        BufferPos startHead{GetHeadPos()};

        // Save the last tail line and column position
        PosTracker lastTailPos{TailPos};

        unsigned accept;

        do {
            // Get the next state out of the table
            state = pDFA->GetTransitionState(state, charReader.GetChar());

            // EmptyTransition means error condition
            if (state == pDFA->EmptyTransition)
                break;

            // If it's an accepting state, record the pTail position and
            // lexeme ID so we can return them if this turns out to be the longest lexeme
            if (accept = pDFA->GetAcceptState(state); accept != 0u) {
                lastLexemeID = accept;
                accept       = charReader.Advance() ? 1u : 0u;
                lastTailPos  = TailPos;
                lastTail     = GetTailPos();
            } else
                accept = charReader.Advance() ? 1u : 0u;

        } while (accept != 0u);

        // If we didn't find a valid lexeme, raise an error, unless we've
        // got an empty lexeme. In this case, there are simply no more characters
        // remaining in the input stream
        if (lastLexemeID == DFA::EmptyTransition) {
            // If we didn't move, and its the end of file, report EOF
            if (charReader.IsEOF() && startHead == GetTailPos())
                code = TokenCode::TokenEOF;
            else {
                // Error - nothing recognized
                SetTailPos(startHead);
                TailPos = HeadPos;
                code    = TokenCode::TokenError;
                if (!charReader.IsEOF())
                    charReader.Advance();
            }
            token.CopyFromTokenizer(code, *this);
            return token;
        }

        // Put the pTail at the end of the lexeme found
        SetTailPos(lastTail);
        // Set the line/offset values to the end of the last lexeme found
        TailPos = lastTailPos;

        // Otherwise, return the lexeme
        // Should be [*pHead, *LastTailPos]
        const auto& lexinfo = pDFA->GetLexemeInfo(lastLexemeID);
        code                = lexinfo.TokenCode;

        // Perform an action, if any
        switch (lexinfo.Action & LexemeInfo::ActionMask) {
            case LexemeInfo::ActionPush:
                ExpressionStack.push_back(ExpressionStackTop);
                // Fall through to goto
                [[fallthrough]];

            case LexemeInfo::ActionGoto:
                ExpressionStackTop = lexinfo.Action & LexemeInfo::ActionValueMask;
                break;

            case LexemeInfo::ActionPop:
                if (!ExpressionStack.empty()) {
                    ExpressionStackTop = ExpressionStack.back();
                    ExpressionStack.pop_back();
                } else { // Empty stack, error
                    ExpressionStackTop = 0u;
                    token.CopyFromTokenizer(TokenCode::TokenError, *this);
                    return token;
                }
                break;
        }

        // if code == 0, then ignore token
    } while (code == 0u);

    token.CopyFromTokenizer(code, *this);
    return token;
}